

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallFilesGenerator::AddFilesInstallRule
          (cmInstallFilesGenerator *this,ostream *os,string *config,Indent *indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  bool bVar1;
  bool bVar2;
  char *permissions_dir;
  char *files_00;
  char *permissions_file;
  char *rename;
  string local_68;
  char *local_48;
  char *no_dir_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  Indent *indent_local;
  string *config_local;
  ostream *os_local;
  cmInstallFilesGenerator *this_local;
  
  local_48 = (char *)0x0;
  no_dir_permissions = (char *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)indent;
  indent_local = (Indent *)config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  GetDestination(&local_68,this,config);
  files_00 = no_dir_permissions;
  bVar1 = this->Programs;
  bVar2 = this->Optional;
  permissions_file = (char *)std::__cxx11::string::c_str();
  permissions_dir = local_48;
  rename = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_68,
             bVar1 & cmInstallType_STATIC_LIBRARY | cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)files_00,(bool)(bVar2 & 1),permissions_file,permissions_dir,rename,(char *)0x0,
             (Indent *)files_local);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmInstallFilesGenerator::AddFilesInstallRule(
  std::ostream& os,
  const std::string config,
  Indent const& indent,
  std::vector<std::string> const& files)
{
  // Write code to install the files.
  const char* no_dir_permissions = 0;
  this->AddInstallRule(os,
                       this->GetDestination(config),
                       (this->Programs
                        ? cmInstallType_PROGRAMS
                        : cmInstallType_FILES),
                       files,
                       this->Optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       this->Rename.c_str(), 0, indent);
}